

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O0

void __thiscall SO3Zero::test_method(SO3Zero *this)

{
  undefined8 uVar1;
  bool bVar2;
  ScalarWithConstIfNotLvalue *pSVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_300;
  basic_cstring<const_char> local_2f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2e0;
  double local_2c0;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_2b3 [3];
  RotationMatrixType local_2b0;
  assertion_result local_268;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_230;
  ReverseQuaternion local_218 [8];
  toQuat xQ;
  Point local_1d8 [8];
  Point x;
  undefined1 local_b0 [8];
  SO3<mnf::ExpMapQuaternion> S;
  SO3Zero *this_local;
  
  S.trustMagnitude_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (double)this;
  mnf::SO3<mnf::ExpMapQuaternion>::SO3((SO3<mnf::ExpMapQuaternion> *)local_b0);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  pSVar3 = Eigen::
           MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::data(&local_230);
  mnf::utils::ReverseQuaternion::ReverseQuaternion(local_218,pSVar3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
               ,0x72);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_250);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_240,0x39,&local_250);
    Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
              (&local_2b0,(RotationBase<Eigen::Quaternion<double,_0>,_3> *)local_218);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    local_2c0 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::
            isApprox<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
                      ((DenseBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_2b0,local_2b3,&local_2c0
                      );
    boost::test_tools::assertion_result::assertion_result(&local_268,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,"xQ.matrix().isApprox(Eigen::Matrix3d::Identity())",0x31);
    boost::unit_test::operator<<(&local_2e0,prev,&local_2f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
               ,0x72);
    boost::test_tools::tt_detail::report_assertion(&local_268,&local_2e0,&local_300,0x39,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2e0);
    boost::test_tools::assertion_result::~assertion_result(&local_268);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mnf::utils::ReverseQuaternion::~ReverseQuaternion(local_218);
  mnf::Point::~Point(local_1d8);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3((SO3<mnf::ExpMapQuaternion> *)local_b0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SO3Zero)
{
  SO3<ExpMapQuaternion> S;
  Point x = S.getZero();
  toQuat xQ(x.value().data());

  BOOST_CHECK(xQ.matrix().isApprox(Eigen::Matrix3d::Identity()));
}